

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_next.c
# Opt level: O3

int NeXTDecode(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  long c;
  byte bVar4;
  uint32_t *puVar5;
  uint uVar6;
  ulong c_00;
  byte *pbVar7;
  char *fmt;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  byte *pbVar12;
  byte *s_00;
  bool bVar13;
  bool bVar14;
  long local_48;
  
  if (0 < occ) {
    memset(buf,0xff,occ);
  }
  c = tif->tif_scanlinesize;
  if (occ % c == 0) {
    pbVar12 = tif->tif_rawcp;
    uVar8 = tif->tif_rawcc;
    if (0 < (long)uVar8 && 0 < occ) {
      local_48 = occ;
      do {
        s_00 = pbVar12 + 1;
        bVar2 = *pbVar12;
        uVar9 = uVar8 - 1;
        if (bVar2 == 0x40) {
          if (uVar8 < 5) {
LAB_002aa132:
            uVar3 = tif->tif_row;
            fmt = "Not enough data for scanline %u";
LAB_002aa164:
            TIFFErrorExtR(tif,"NeXTDecode",fmt,(ulong)uVar3);
            return 0;
          }
          c_00 = (ulong)(ushort)(*(ushort *)(pbVar12 + 3) << 8 | *(ushort *)(pbVar12 + 3) >> 8);
          uVar1 = c_00 + 4;
          if ((uVar8 <= uVar1) ||
             (uVar8 = (ulong)(ushort)(*(ushort *)(pbVar12 + 1) << 8 | *(ushort *)(pbVar12 + 1) >> 8)
             , c < (long)(c_00 + uVar8))) goto LAB_002aa132;
          _TIFFmemcpy(buf + uVar8,pbVar12 + 5,c_00);
          pbVar12 = s_00 + uVar1;
          uVar8 = uVar9 - uVar1;
        }
        else if (bVar2 == 0) {
          if ((long)uVar8 <= c) goto LAB_002aa132;
          _TIFFmemcpy(buf,s_00,c);
          uVar8 = uVar9 - c;
          pbVar12 = s_00 + c;
        }
        else {
          puVar5 = &(tif->tif_dir).td_tilewidth;
          if ((tif->tif_flags & 0x400) == 0) {
            puVar5 = &(tif->tif_dir).td_imagewidth;
          }
          uVar3 = *puVar5;
          uVar6 = 0;
          lVar11 = 0;
          pbVar7 = buf;
          while( true ) {
            bVar13 = uVar6 < uVar3;
            bVar14 = lVar11 < c;
            if ((((bVar2 & 0x3f) != 0) && (uVar6 < uVar3)) && (lVar11 < c)) {
              bVar4 = bVar2 >> 6;
              uVar8 = (ulong)(bVar2 & 0x3f);
              do {
                switch(uVar6 & 3) {
                case 0:
                  *pbVar7 = bVar2 & 0xc0;
                  break;
                case 1:
                  *pbVar7 = *pbVar7 | bVar4 << 4;
                  break;
                case 2:
                  *pbVar7 = *pbVar7 | bVar4 * '\x04';
                  break;
                case 3:
                  *pbVar7 = *pbVar7 | bVar4;
                  pbVar7 = pbVar7 + 1;
                  lVar11 = lVar11 + 1;
                }
                uVar6 = uVar6 + 1;
                bVar13 = uVar6 < uVar3;
                bVar14 = lVar11 < c;
              } while (((1 < uVar8) && (uVar6 < uVar3)) && (uVar8 = uVar8 - 1, lVar11 < c));
            }
            uVar8 = uVar9;
            pbVar12 = s_00;
            if (!bVar13) break;
            if (!bVar14) {
              uVar3 = tif->tif_row;
              fmt = "Invalid data for scanline %u";
              goto LAB_002aa164;
            }
            bVar14 = uVar9 == 0;
            uVar9 = uVar9 - 1;
            if (bVar14) goto LAB_002aa132;
            bVar2 = *s_00;
            s_00 = s_00 + 1;
          }
        }
        if ((long)uVar8 < 1) break;
        local_48 = local_48 - c;
        buf = buf + c;
      } while (0 < local_48);
    }
    tif->tif_rawcp = pbVar12;
    tif->tif_rawcc = uVar8;
    iVar10 = 1;
  }
  else {
    iVar10 = 0;
    TIFFErrorExtR(tif,"NeXTDecode","Fractional scanlines cannot be read");
  }
  return iVar10;
}

Assistant:

static int NeXTDecode(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    static const char module[] = "NeXTDecode";
    unsigned char *bp, *op;
    tmsize_t cc;
    uint8_t *row;
    tmsize_t scanline, n;

    (void)s;
    /*
     * Each scanline is assumed to start off as all
     * white (we assume a PhotometricInterpretation
     * of ``min-is-black'').
     */
    for (op = (unsigned char *)buf, cc = occ; cc-- > 0;)
        *op++ = 0xff;

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    scanline = tif->tif_scanlinesize;
    if (occ % scanline)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (0);
    }
    for (row = buf; cc > 0 && occ > 0; occ -= scanline, row += scanline)
    {
        n = *bp++;
        cc--;
        switch (n)
        {
            case LITERALROW:
                /*
                 * The entire scanline is given as literal values.
                 */
                if (cc < scanline)
                    goto bad;
                _TIFFmemcpy(row, bp, scanline);
                bp += scanline;
                cc -= scanline;
                break;
            case LITERALSPAN:
            {
                tmsize_t off;
                /*
                 * The scanline has a literal span that begins at some
                 * offset.
                 */
                if (cc < 4)
                    goto bad;
                off = (bp[0] * 256) + bp[1];
                n = (bp[2] * 256) + bp[3];
                if (cc < 4 + n || off + n > scanline)
                    goto bad;
                _TIFFmemcpy(row + off, bp + 4, n);
                bp += 4 + n;
                cc -= 4 + n;
                break;
            }
            default:
            {
                uint32_t npixels = 0, grey;
                tmsize_t op_offset = 0;
                uint32_t imagewidth = tif->tif_dir.td_imagewidth;
                if (isTiled(tif))
                    imagewidth = tif->tif_dir.td_tilewidth;

                /*
                 * The scanline is composed of a sequence of constant
                 * color ``runs''.  We shift into ``run mode'' and
                 * interpret bytes as codes of the form
                 * <color><npixels> until we've filled the scanline.
                 */
                op = row;
                for (;;)
                {
                    grey = (uint32_t)((n >> 6) & 0x3);
                    n &= 0x3f;
                    /*
                     * Ensure the run does not exceed the scanline
                     * bounds, potentially resulting in a security
                     * issue.
                     */
                    while (n-- > 0 && npixels < imagewidth &&
                           op_offset < scanline)
                        SETPIXEL(op, grey);
                    if (npixels >= imagewidth)
                        break;
                    if (op_offset >= scanline)
                    {
                        TIFFErrorExtR(tif, module,
                                      "Invalid data for scanline %" PRIu32,
                                      tif->tif_row);
                        return (0);
                    }
                    if (cc == 0)
                        goto bad;
                    n = *bp++;
                    cc--;
                }
                break;
            }
        }
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
bad:
    TIFFErrorExtR(tif, module, "Not enough data for scanline %" PRIu32,
                  tif->tif_row);
    return (0);
}